

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

void parse_modules(options_i *options,vw *all)

{
  vw_ostream *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostream *poVar3;
  option_group_definition rand_options;
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  string local_140;
  option_group_definition local_120;
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Randomization options","");
  paVar2 = &local_120.m_name.field_2;
  local_120.m_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_120,local_e8,local_e8 + local_e0);
  local_120.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"random_seed","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_c8,&local_140,&all->random_seed);
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_160,"seed random number generator","");
  std::__cxx11::string::_M_assign((string *)(local_c8 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_120,(typed_option<unsigned_long> *)local_c8);
  if (local_160[0] != local_150) {
    operator_delete(local_160[0]);
  }
  local_c8._0_8_ = &PTR__typed_option_002e8f20;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_120);
  all->random_state = all->random_seed;
  parse_feature_tweaks(options,all);
  parse_example_tweaks(options,all);
  parse_output_model(options,all);
  parse_output_preds(options,all);
  parse_reductions(options,all);
  if (all->quiet == false) {
    pvVar1 = &all->trace_message;
    std::__ostream_insert<char,std::char_traits<char>>
              (&pvVar1->super_ostream,"Num weight bits = ",0x12);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)pvVar1);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (&pvVar1->super_ostream,"learning rate = ",0x10);
    poVar3 = std::ostream::_M_insert<double>((double)all->eta);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream,"initial_t = ",0xc);
    poVar3 = std::ostream::_M_insert<double>(all->sd->t);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream,"power_t = ",10);
    poVar3 = std::ostream::_M_insert<double>((double)all->power_t);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (1 < all->numpasses) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar1->super_ostream,"decay_learning_rate = ",0x16);
      poVar3 = std::ostream::_M_insert<double>((double)all->eta_decay_rate);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_120.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_120.m_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void parse_modules(options_i& options, vw& all)
{
  option_group_definition rand_options("Randomization options");
  rand_options.add(make_option("random_seed", all.random_seed).help("seed random number generator"));
  options.add_and_parse(rand_options);
  all.random_state = all.random_seed;

  parse_feature_tweaks(options, all);  // feature tweaks

  parse_example_tweaks(options, all);  // example manipulation

  parse_output_model(options, all);

  parse_output_preds(options, all);

  parse_reductions(options, all);

  if (!all.quiet)
  {
    all.trace_message << "Num weight bits = " << all.num_bits << endl;
    all.trace_message << "learning rate = " << all.eta << endl;
    all.trace_message << "initial_t = " << all.sd->t << endl;
    all.trace_message << "power_t = " << all.power_t << endl;
    if (all.numpasses > 1)
      all.trace_message << "decay_learning_rate = " << all.eta_decay_rate << endl;
  }
}